

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcScorr.c
# Opt level: O1

int Abc_NtkTestScorrWriteEquivGia(Tst_Dat_t *pData)

{
  Abc_Ntk_t *pNetlist;
  Gia_Man_t *p;
  Vec_Int_t *vId2Name;
  Gia_Obj_t *pGVar1;
  int iVar2;
  FILE *__stream;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char *pName;
  long lVar6;
  uint uVar7;
  
  pNetlist = pData->pNetlist;
  p = pData->pGia;
  vId2Name = pData->vId2Name;
  pName = pData->pFileNameOut;
  if (pData->fDumpBmc != 0) {
    pData->fDumpBmc = 0;
    Abc_NtkBmcFileName(pName);
    pName = Abc_NtkBmcFileName::Buffer;
  }
  __stream = fopen(pName,"wb");
  Gia_ManSetPhase(p);
  uVar3 = (ulong)(uint)p->nObjs;
  if (p->nObjs < 1) {
    uVar7 = 0;
  }
  else {
    lVar5 = 0;
    lVar6 = 0;
    uVar7 = 0;
    do {
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      uVar4 = (ulong)(uint)p->pReprs[lVar6] & 0xfffffff;
      if (uVar4 != 0xfffffff) {
        iVar2 = (int)uVar4;
        if ((int)uVar3 <= iVar2) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pData->fFlopOnly == 0) {
          if ((pData->fFfNdOnly != 0) &&
             ((((uint)*(undefined8 *)(&pGVar1->field_0x0 + lVar5) & 0x9fffffff) != 0x9fffffff ||
              ((int)((uint)((ulong)*(undefined8 *)(&pGVar1->field_0x0 + lVar5) >> 0x20) & 0x1fffffff
                    ) < p->vCis->nSize - p->nRegs)))) goto LAB_00310f27;
          goto LAB_00310f7a;
        }
        if ((((uint)*(undefined8 *)(&pGVar1->field_0x0 + lVar5) & 0x9fffffff) == 0x9fffffff) &&
           (p->vCis->nSize - p->nRegs <=
            (int)((uint)((ulong)*(undefined8 *)(&pGVar1->field_0x0 + lVar5) >> 0x20) & 0x1fffffff)))
        {
LAB_00310f27:
          uVar3 = *(ulong *)(pGVar1 + uVar4);
          if (((uint)uVar3 & 0x9fffffff) == 0x9fffffff) {
            if (((~uVar3 & 0x1fffffff1fffffff) == 0) ||
               (p->vCis->nSize - p->nRegs <= (int)((uint)(uVar3 >> 0x20) & 0x1fffffff))) {
LAB_00310f7a:
              if (iVar2 == 0) {
                iVar2 = Abc_NtkTestScorrWriteEquivConst
                                  (pNetlist,vId2Name,(int)lVar6,(FILE *)__stream,
                                   (uint)((ulong)*(undefined8 *)(&pGVar1->field_0x0 + lVar5) >> 0x3f
                                         ));
              }
              else {
                iVar2 = Abc_NtkTestScorrWriteEquivPair
                                  (pNetlist,vId2Name,iVar2,(int)lVar6,(FILE *)__stream,
                                   ((uint)((ulong)*(undefined8 *)(&pGVar1->field_0x0 + lVar5) >>
                                          0x20) ^
                                   (uint)((ulong)*(undefined8 *)(pGVar1 + uVar4) >> 0x20)) >> 0x1f);
              }
              uVar7 = uVar7 + iVar2;
            }
          }
          else if ((~uVar3 & 0x1fffffff1fffffff) == 0) goto LAB_00310f7a;
        }
      }
      lVar6 = lVar6 + 1;
      uVar3 = (ulong)p->nObjs;
      lVar5 = lVar5 + 0xc;
    } while (lVar6 < (long)uVar3);
  }
  fclose(__stream);
  printf("%d pairs of sequentially equivalent nodes are written into file \"%s\".\n",(ulong)uVar7,
         pName);
  return uVar7;
}

Assistant:

int Abc_NtkTestScorrWriteEquivGia( Tst_Dat_t * pData )
{
    Abc_Ntk_t * pNetlist = pData->pNetlist;
    Vec_Int_t * vId2Name = pData->vId2Name;
    Gia_Man_t * pGia     = pData->pGia;
    char * pFileNameOut  = pData->pFileNameOut;
    FILE * pFile;
    Gia_Obj_t * pObj, * pRepr;
    int i, Counter = 0;
    if ( pData->fDumpBmc )
    {
        pData->fDumpBmc = 0;
        pFileNameOut = Abc_NtkBmcFileName( pFileNameOut );
    }
    pFile = fopen( pFileNameOut, "wb" );
    Gia_ManSetPhase( pGia );
    Gia_ManForEachObj( pGia, pObj, i )
    {
        if ( !Gia_ObjHasRepr(pGia, i) )
            continue;
        pRepr = Gia_ManObj( pGia,Gia_ObjRepr(pGia, i) );
        if ( pData->fFlopOnly )
        {
            if ( !Gia_ObjIsRo(pGia, pObj) || !(Gia_ObjIsRo(pGia, pRepr)||Gia_ObjIsConst0(pRepr)) )
                continue;
        }
        else if ( pData->fFfNdOnly )
        {
            if ( !Gia_ObjIsRo(pGia, pObj) && !(Gia_ObjIsRo(pGia, pRepr)||Gia_ObjIsConst0(pRepr)) )
                continue;
        }
        if ( Gia_ObjRepr(pGia, i) == 0 )
            Counter += Abc_NtkTestScorrWriteEquivConst( pNetlist, vId2Name, i, pFile, Gia_ObjPhase(pObj) );
        else
            Counter += Abc_NtkTestScorrWriteEquivPair( pNetlist, vId2Name, Gia_ObjRepr(pGia, i), i, pFile, 
                Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
    }
    fclose( pFile );
    printf( "%d pairs of sequentially equivalent nodes are written into file \"%s\".\n", Counter, pFileNameOut );
    return Counter;
}